

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioSetISRFuncEx(uint gpio,uint edge,int timeout,gpioAlertFuncEx_t f,void *userdata)

{
  FILE *__stream;
  int iVar1;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: gpio=%d edge=%d timeout=%d function=%08X userdata=%08X\n",
            myTimeStamp::buf,"gpioSetISRFuncEx",gpio,edge,(ulong)(uint)timeout,f,userdata);
  }
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetISRFuncEx_cold_1();
    }
  }
  else if (gpio < 0x36) {
    if (edge < 3) {
      iVar1 = intGpioSetISRFunc(gpio,edge,timeout,f,1,userdata);
      return iVar1;
    }
    iVar1 = -0x7a;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetISRFuncEx_cold_2();
    }
  }
  else {
    iVar1 = -3;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetISRFuncEx_cold_3();
    }
  }
  return iVar1;
}

Assistant:

int gpioSetISRFuncEx(
   unsigned gpio,
   unsigned edge,
   int timeout,
   gpioAlertFuncEx_t f,
   void *userdata)
{
   DBG(DBG_USER, "gpio=%d edge=%d timeout=%d function=%08X userdata=%08X",
      gpio, edge, timeout, (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED;

   if (gpio > PI_MAX_GPIO)
      SOFT_ERROR(PI_BAD_GPIO, "bad gpio (%d)", gpio);

   if (edge > EITHER_EDGE)
      SOFT_ERROR(PI_BAD_EDGE, "bad ISR edge (%d)", edge);

   return intGpioSetISRFunc(gpio, edge, timeout, f, 1, userdata);
}